

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateLSTMWeightParams
                   (Result *__return_storage_ptr__,LSTMWeightParams *lstmWeightParams,
                   LSTMParams *lstmParams)

{
  bool bVar1;
  bool bVar2;
  WeightParams *pWVar3;
  allocator local_59;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypes;
  string err;
  
  bVar2 = lstmParams->hasbiasvectors_;
  bVar1 = lstmParams->haspeepholevectors_;
  weightTypes.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  weightTypes.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  weightTypes.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pWVar3 = lstmWeightParams->inputgateweightmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->forgetgateweightmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->blockinputweightmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->outputgateweightmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->inputgaterecursionmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->forgetgaterecursionmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->blockinputrecursionmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  pWVar3 = lstmWeightParams->outputgaterecursionmatrix_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  if (bVar2 != false) {
    pWVar3 = lstmWeightParams->inputgatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
    pWVar3 = lstmWeightParams->forgetgatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
    pWVar3 = lstmWeightParams->blockinputbiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
    pWVar3 = lstmWeightParams->outputgatebiasvector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  }
  if (bVar1 != false) {
    pWVar3 = lstmWeightParams->inputgatepeepholevector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
    pWVar3 = lstmWeightParams->forgetgatepeepholevector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
    pWVar3 = lstmWeightParams->outputgatepeepholevector_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType(pWVar3);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypes,(WeightParamType *)&err);
  }
  bVar2 = isWeightParamTypeCompatible(&weightTypes);
  if (bVar2) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string
              ((string *)&err,
               "LSTM weight parameters have inconsistent field value types. Types should match and should be either half or full precision"
               ,&local_59);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  std::_Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  ~_Vector_base(&weightTypes.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               );
  return __return_storage_ptr__;
}

Assistant:

inline Result validateLSTMWeightParams(const Specification::LSTMWeightParams& lstmWeightParams, const Specification::LSTMParams lstmParams) {
    bool has_peephole_vector = lstmParams.haspeepholevectors();
    bool has_bias_vector = lstmParams.hasbiasvectors();
    
    // Validate all weightParam types match
    std::vector<CoreML::WeightParamType> weightTypes;
    weightTypes.push_back(valueType(lstmWeightParams.inputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgateweightmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.inputgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.forgetgaterecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.blockinputrecursionmatrix()));
    weightTypes.push_back(valueType(lstmWeightParams.outputgaterecursionmatrix()));
    if(has_bias_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatebiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.blockinputbiasvector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatebiasvector()));
    }
    if(has_peephole_vector){
        weightTypes.push_back(valueType(lstmWeightParams.inputgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.forgetgatepeepholevector()));
        weightTypes.push_back(valueType(lstmWeightParams.outputgatepeepholevector()));
    }
    if(!isWeightParamTypeCompatible(weightTypes)){
        const std::string err = "LSTM weight parameters have inconsistent field value types. "
        "Types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}